

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O0

Task * __thiscall
tf::Task::succeed<tf::Task&,tf::Task&,tf::Task&>(Task *this,Task *tasks,Task *tasks_1,Task *tasks_2)

{
  Node *in_RDI;
  Node *unaff_retaddr;
  Node *v;
  
  v = in_RDI;
  Node::_precede(unaff_retaddr,in_RDI);
  Node::_precede(unaff_retaddr,v);
  Node::_precede(unaff_retaddr,v);
  return (Task *)in_RDI;
}

Assistant:

Task& Task::succeed(Ts&&... tasks) {
  (tasks._node->_precede(_node), ...);
  //_succeed(std::forward<Ts>(tasks)...);
  return *this;
}